

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O1

ssize_t __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response::
write(Response *this,int __fd,void *__buf,size_t __n)

{
  _Base_ptr p_Var1;
  _Base_ptr *in_RAX;
  map<SimpleWeb::StatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<SimpleWeb::StatusCode>,_std::allocator<std::pair<const_SimpleWeb::StatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  ssize_t extraout_RAX;
  _Base_ptr p_Var5;
  _Base_ptr *local_28;
  
  local_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(&this->super_ostream,"HTTP/1.1 ",9);
  pmVar2 = status_code_strings_abi_cxx11_();
  p_Var5 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var5;
  for (p_Var1 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < __fd]) {
    if (__fd <= (int)p_Var1[1]._M_color) {
      p_Var3 = p_Var1;
    }
  }
  if ((p_Var3 != p_Var5) && ((int)p_Var3[1]._M_color <= __fd)) {
    p_Var5 = p_Var3;
  }
  pmVar2 = status_code_strings_abi_cxx11_();
  if ((_Rb_tree_header *)p_Var5 == &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
    if (status_code[abi:cxx11](SimpleWeb::StatusCode)::empty_string_abi_cxx11_ == '\0') {
      ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response::write
                ((Response *)&local_28);
    }
    else {
      local_28 = (_Base_ptr *)
                 &status_code[abi:cxx11](SimpleWeb::StatusCode)::empty_string_abi_cxx11_;
    }
  }
  else {
    local_28 = &p_Var5[1]._M_parent;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&this->super_ostream,(char *)*local_28,(long)local_28[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\n",2);
  write_header<int>(this,(CaseInsensitiveMultimap *)__buf,0);
  return extraout_RAX;
}

Assistant:

void write(StatusCode status_code = StatusCode::success_ok, const CaseInsensitiveMultimap &header = CaseInsensitiveMultimap()) {
        *this << "HTTP/1.1 " << SimpleWeb::status_code(status_code) << "\r\n";
        write_header(header, 0);
      }